

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressStream_simpleArgs
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,size_t *dstPos,void *src,
                 size_t srcSize,size_t *srcPos)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  undefined8 *in_RCX;
  size_t cErr;
  ZSTD_inBuffer input;
  ZSTD_outBuffer output;
  ZSTD_inBuffer *in_stack_00000148;
  ZSTD_outBuffer *in_stack_00000150;
  ZSTD_DStream *in_stack_00000158;
  
  uVar1 = *in_RCX;
  uVar2 = *input.src;
  sVar3 = ZSTD_decompressStream(in_stack_00000158,in_stack_00000150,in_stack_00000148);
  *in_RCX = uVar1;
  *(undefined8 *)input.src = uVar2;
  return sVar3;
}

Assistant:

size_t ZSTD_decompressStream_simpleArgs (
                            ZSTD_DCtx* dctx,
                            void* dst, size_t dstCapacity, size_t* dstPos,
                      const void* src, size_t srcSize, size_t* srcPos)
{
    ZSTD_outBuffer output;
    ZSTD_inBuffer  input;
    output.dst = dst;
    output.size = dstCapacity;
    output.pos = *dstPos;
    input.src = src;
    input.size = srcSize;
    input.pos = *srcPos;
    {   size_t const cErr = ZSTD_decompressStream(dctx, &output, &input);
        *dstPos = output.pos;
        *srcPos = input.pos;
        return cErr;
    }
}